

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

int64_t __thiscall
icu_63::CollationDataBuilder::getSingleCE
          (CollationDataBuilder *this,UChar32 c,UErrorCode *errorCode)

{
  int64_t **ppiVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint *puVar5;
  uint32_t *puVar6;
  int64_t **ppiVar7;
  int64_t *piVar8;
  int64_t dataCE;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  uVar2 = utrie2_get32_63(this->trie,c);
  uVar3 = uVar2;
  if (uVar2 == 0xc0) {
    uVar3 = CollationData::getCE32(this->base,c);
  }
  if ((~uVar3 & 0xc0) == 0) {
    ppiVar1 = &(this->ce64s).elements;
    do {
      switch(uVar3 & 0xf) {
      case 0:
      case 3:
        *errorCode = U_INTERNAL_PROGRAM_ERROR;
        return 0;
      case 1:
        uVar3 = uVar3 & 0xffffff00;
        goto LAB_002418a0;
      case 2:
        return (ulong)(uVar3 & 0xffffff00);
      default:
        goto switchD_0024177e_caseD_4;
      case 5:
        if ((uVar3 & 0x1f00) != 0x100) goto switchD_0024177e_caseD_4;
        if (uVar2 != 0xc0) goto LAB_002417d6;
        puVar6 = this->base->ce32s;
        goto LAB_002417df;
      case 6:
        if ((uVar3 & 0x1f00) == 0x100) {
          if (uVar2 == 0xc0) {
            piVar8 = this->base->ces;
          }
          else {
            if ((this->ce64s).count <= (int)(uVar3 >> 0xd)) {
              return 0;
            }
            piVar8 = *ppiVar1;
          }
          return piVar8[uVar3 >> 0xd];
        }
        goto switchD_0024177e_caseD_4;
      case 10:
LAB_002417d6:
        if ((this->ce32s).count <= (int)(uVar3 >> 0xd)) {
LAB_0024182d:
          uVar3 = 0;
          goto LAB_0024182f;
        }
        puVar6 = (uint32_t *)(this->ce32s).elements;
LAB_002417df:
        uVar3 = puVar6[uVar3 >> 0xd];
        break;
      case 0xb:
        if (uVar2 == 0xc0) {
          puVar5 = this->base->ce32s;
        }
        else {
          if ((this->ce32s).count < 1) goto LAB_0024182d;
          puVar5 = (uint *)(this->ce32s).elements;
        }
        uVar3 = *puVar5;
        break;
      case 0xe:
        if (uVar2 == 0xc0) {
          ppiVar7 = &this->base->ces;
LAB_002417ee:
          dataCE = (*ppiVar7)[uVar3 >> 0xd];
        }
        else {
          ppiVar7 = ppiVar1;
          if ((int)(uVar3 >> 0xd) < (this->ce64s).count) goto LAB_002417ee;
          dataCE = 0;
        }
        uVar4 = Collation::getThreeBytePrimaryForOffsetData(c,dataCE);
        uVar3 = uVar4 | 0xc1;
        break;
      case 0xf:
        uVar3 = Collation::unassignedPrimaryFromCodePoint(c);
LAB_002418a0:
        return (ulong)uVar3 << 0x20 | 0x5000500;
      }
    } while ((~uVar3 & 0xc0) == 0);
  }
LAB_0024182f:
  return (ulong)((uVar3 & 0xff) << 8) | CONCAT44(uVar3,uVar3 << 0x10) & 0xffff0000ff000000;
switchD_0024177e_caseD_4:
  *errorCode = U_UNSUPPORTED_ERROR;
  return 0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }